

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O2

sxi32 SyMemBackendInitFromOthers
                (SyMemBackend *pBackend,SyMemMethods *pMethods,ProcMemError xMemErr,void *pUserData)

{
  sxi32 sVar1;
  int iVar2;
  sxi32 sVar3;
  
  sVar1 = -9;
  sVar3 = -9;
  if ((((pMethods->xAlloc != (_func_void_ptr_uint *)0x0) &&
       (sVar3 = sVar1, pMethods->xRealloc != (_func_void_ptr_void_ptr_uint *)0x0)) &&
      (pMethods->xFree != (_func_void_void_ptr *)0x0)) &&
     (pMethods->xChunkSize != (_func_uint_void_ptr *)0x0)) {
    SyZero(pBackend,0xb8);
    pBackend->xMemError = xMemErr;
    pBackend->pUserData = pUserData;
    pBackend->pMethods = pMethods;
    if ((pMethods->xInit == (_func_int_void_ptr *)0x0) ||
       (iVar2 = (*pMethods->xInit)(pMethods->pUserData), iVar2 == 0)) {
      sVar3 = 0;
    }
    else {
      sVar3 = -10;
    }
  }
  return sVar3;
}

Assistant:

JX9_PRIVATE sxi32 SyMemBackendInitFromOthers(SyMemBackend *pBackend, const SyMemMethods *pMethods, ProcMemError xMemErr, void * pUserData)
{
#if defined(UNTRUST)
	if( pBackend == 0 || pMethods == 0){
		return SXERR_EMPTY;
	}
#endif
	if( pMethods->xAlloc == 0 || pMethods->xRealloc == 0 || pMethods->xFree == 0 || pMethods->xChunkSize == 0 ){
		/* mandatory methods are missing */
		return SXERR_INVALID;
	}
	/* Zero the allocator first */
	SyZero(&(*pBackend), sizeof(SyMemBackend));
	pBackend->xMemError = xMemErr;
	pBackend->pUserData = pUserData;
	/* Switch to the host application memory allocator */
	pBackend->pMethods = pMethods;
	if( pBackend->pMethods->xInit ){
		/* Initialize the backend  */
		if( SXRET_OK != pBackend->pMethods->xInit(pBackend->pMethods->pUserData) ){
			return SXERR_ABORT;
		}
	}
#if defined(UNTRUST)
	pBackend->nMagic = SXMEM_BACKEND_MAGIC;
#endif
	return SXRET_OK;
}